

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

ALLEGRO_SYSTEM * find_system(_AL_VECTOR *vector)

{
  long *plVar1;
  ALLEGRO_SYSTEM *pAVar2;
  ulong uVar3;
  
  if (vector->_size != 0) {
    uVar3 = 0;
    do {
      plVar1 = (long *)_al_vector_ref(vector,(uint)uVar3);
      pAVar2 = (ALLEGRO_SYSTEM *)(**(code **)(*plVar1 + 8))(0);
      if (pAVar2 != (ALLEGRO_SYSTEM *)0x0) {
        return pAVar2;
      }
      uVar3 = (ulong)((uint)uVar3 + 1);
    } while (uVar3 < vector->_size);
  }
  return (ALLEGRO_SYSTEM *)0x0;
}

Assistant:

static ALLEGRO_SYSTEM *find_system(_AL_VECTOR *vector)
{
   ALLEGRO_SYSTEM_INTERFACE **sptr;
   ALLEGRO_SYSTEM_INTERFACE *sys_interface;
   ALLEGRO_SYSTEM *system;
   unsigned int i;

   for (i = 0; i < vector->_size; i++) {
      sptr = _al_vector_ref(vector, i);
      sys_interface = *sptr;
      if ((system = sys_interface->initialize(0)) != NULL)
         return system;
   }

   return NULL;
}